

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)0>::write_palette
          (Base<(TI::TMS::Personality)0> *this,uint8_t value)

{
  uint8_t value_local;
  Base<(TI::TMS::Personality)0> *this_local;
  
  return;
}

Assistant:

void Base<personality>::write_palette(uint8_t value) {
	if constexpr (is_yamaha_vdp(personality)) {
		if(!Storage<personality>::palette_write_phase_) {
			Storage<personality>::new_colour_ = value;
			Storage<personality>::palette_write_phase_ = true;
			return;
		}

		Storage<personality>::palette_write_phase_ = false;

		const uint8_t r = ((Storage<personality>::new_colour_ >> 4) & 7) * 255 / 7;
		const uint8_t g = (value & 7) * 255 / 7;
		const uint8_t b = (Storage<personality>::new_colour_ & 7) * 255 / 7;

		Storage<personality>::palette_[Storage<personality>::palette_entry_ & 0xf] = palette_pack(r, g, b);
		Storage<personality>::background_palette_[Storage<personality>::palette_entry_ & 0xf] = palette_pack(r, g, b);
		Storage<personality>::background_palette_[0] = Storage<personality>::palette_[background_colour_];

		++Storage<personality>::palette_entry_;
	}
}